

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

ScopedElement * __thiscall
Catch::XmlWriter::ScopedElement::operator=(ScopedElement *this,ScopedElement *other)

{
  undefined8 *in_RSI;
  ScopedElement *in_RDI;
  XmlFormatting in_stack_0000000c;
  XmlWriter *in_stack_00000010;
  
  if (in_RDI->m_writer != (XmlWriter *)0x0) {
    operator|(Newline,Indent);
    endElement(in_stack_00000010,in_stack_0000000c);
  }
  in_RDI->m_writer = (XmlWriter *)*in_RSI;
  *in_RSI = 0;
  in_RDI->m_fmt = *(XmlFormatting *)(in_RSI + 1);
  *(undefined4 *)(in_RSI + 1) = 0;
  return in_RDI;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::operator=( ScopedElement&& other ) noexcept {
        if ( m_writer ) {
            m_writer->endElement();
        }
        m_writer = other.m_writer;
        other.m_writer = nullptr;
        m_fmt = other.m_fmt;
        other.m_fmt = XmlFormatting::None;
        return *this;
    }